

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

Expression *
slang::ast::DistExpression::fromSyntax
          (Compilation *comp,ExpressionOrDistSyntax *syntax,ASTContext *context)

{
  Expression *args_1;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  DistConstraintListSyntax *pDVar4;
  DistItemSyntax *pDVar5;
  ExpressionSyntax *pEVar6;
  undefined4 extraout_var;
  Type *args;
  reference ppEVar7;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *src;
  iterator iVar8;
  iterator iVar9;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_fffffffffffffc98;
  SourceRange local_248;
  span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> local_238;
  Compilation *local_228;
  DistExpression *result;
  Expression *local_218;
  bitmask<slang::ast::ASTFlags> local_210;
  Expression *local_208;
  Expression *weightExpr;
  undefined1 auStack_1f8 [4];
  Kind weightKind;
  DistItem di;
  DistItemSyntax *item_1;
  iterator __end2_1;
  iterator __begin2_1;
  SeparatedSyntaxList<slang::syntax::DistItemSyntax> *__range2_1;
  size_t index;
  SmallVector<slang::ast::DistExpression::DistItem,_4UL> items;
  pointer ppEStack_100;
  byte local_f1;
  undefined1 local_f0 [7];
  bool bad;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  DistItemSyntax *item;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::DistItemSyntax> *__range2;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  ASTContext *context_local;
  ExpressionOrDistSyntax *syntax_local;
  Compilation *comp_local;
  
  expressions.stackBase._24_8_ = context;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL>::SmallVector
            ((SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> *)&__range2);
  pDVar4 = not_null<slang::syntax::DistConstraintListSyntax_*>::operator->(&syntax->distribution);
  iVar8 = slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>::begin(&pDVar4->items);
  __end2.index = (size_t)iVar8.list;
  iVar8 = slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>::end(&pDVar4->items);
  while( true ) {
    __end2.list = (ParentList *)iVar8.index;
    item = (DistItemSyntax *)iVar8.list;
    bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>::iterator_base<slang::syntax::DistItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DistItemSyntax_*,_unsigned_long,_slang::syntax::DistItemSyntax_**,_slang::syntax::DistItemSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>::iterator_base<slang::syntax::DistItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DistItemSyntax_*,_unsigned_long,_slang::syntax::DistItemSyntax_**,_slang::syntax::DistItemSyntax_*&>
                          *)&__end2.index,(iterator_base<slang::syntax::DistItemSyntax_*> *)&item);
    if (!bVar2) break;
    pDVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>::
             iterator_base<slang::syntax::DistItemSyntax_*>::operator*
                       ((iterator_base<slang::syntax::DistItemSyntax_*> *)&__end2.index);
    bound.stackBase._24_8_ =
         not_null::operator_cast_to_ExpressionSyntax_((not_null *)&pDVar5->range);
    SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::push_back
              ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)&__range2,
               (ExpressionSyntax **)(bound.stackBase + 0x18));
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>::iterator_base<slang::syntax::DistItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DistItemSyntax_*,_unsigned_long,_slang::syntax::DistItemSyntax_**,_slang::syntax::DistItemSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>::iterator_base<slang::syntax::DistItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DistItemSyntax_*,_unsigned_long,_slang::syntax::DistItemSyntax_**,_slang::syntax::DistItemSyntax_*&>
                  *)&__end2.index);
    iVar8.index = (size_t)__end2.list;
    iVar8.list = (ParentList *)item;
  }
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)local_f0);
  uVar1 = expressions.stackBase._24_8_;
  pEVar6 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->expr);
  nonstd::span_lite::span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>::
  span<slang::SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL>,_0>
            ((span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> *)
             (items.stackBase + 0x58),
             (SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> *)&__range2);
  expressions_00.size_ = (size_type)local_f0;
  expressions_00.data_ = ppEStack_100;
  bVar2 = Expression::bindMembershipExpressions
                    ((Expression *)uVar1,(ASTContext *)0x8b,EndOfFile,false,false,true,
                     SUB81(pEVar6,0),(ExpressionSyntax *)items.stackBase._88_8_,expressions_00,
                     in_stack_fffffffffffffc98);
  local_f1 = ~bVar2 & 1;
  SmallVector<slang::ast::DistExpression::DistItem,_4UL>::SmallVector
            ((SmallVector<slang::ast::DistExpression::DistItem,_4UL> *)&index);
  __range2_1 = (SeparatedSyntaxList<slang::syntax::DistItemSyntax> *)0x1;
  pDVar4 = not_null<slang::syntax::DistConstraintListSyntax_*>::operator->(&syntax->distribution);
  iVar8 = slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>::begin(&pDVar4->items);
  __end2_1.index = (size_t)iVar8.list;
  iVar9 = slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>::end(&pDVar4->items);
  while( true ) {
    __end2_1.list = (ParentList *)iVar9.index;
    item_1 = (DistItemSyntax *)iVar9.list;
    bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>::iterator_base<slang::syntax::DistItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DistItemSyntax_*,_unsigned_long,_slang::syntax::DistItemSyntax_**,_slang::syntax::DistItemSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>::iterator_base<slang::syntax::DistItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DistItemSyntax_*,_unsigned_long,_slang::syntax::DistItemSyntax_**,_slang::syntax::DistItemSyntax_*&>
                          *)&__end2_1.index,
                         (iterator_base<slang::syntax::DistItemSyntax_*> *)&item_1);
    if (!bVar2) break;
    di.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._16_8_ =
         slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>::
         iterator_base<slang::syntax::DistItemSyntax_*>::operator*
                   ((iterator_base<slang::syntax::DistItemSyntax_*> *)&__end2_1.index);
    ppEVar7 = SmallVectorBase<const_slang::ast::Expression_*>::operator[]
                        ((SmallVectorBase<const_slang::ast::Expression_*> *)local_f0,
                         (size_type)__range2_1);
    _auStack_1f8 = *ppEVar7;
    std::optional<slang::ast::DistExpression::DistWeight>::optional
              ((optional<slang::ast::DistExpression::DistWeight> *)&di);
    if (*(long *)(di.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>
                  ._M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                  _16_8_ + 0x18) != 0) {
      weightExpr._4_4_ =
           (uint)(*(short *)(*(long *)(di.weight.
                                       super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<slang::ast::DistExpression::DistWeight>
                                       ._16_8_ + 0x18) + 0x10) == 0x18);
      pEVar6 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                         ((not_null<slang::syntax::ExpressionSyntax_*> *)
                          (*(long *)(di.weight.
                                     super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>
                                     ._M_payload.
                                     super__Optional_payload_base<slang::ast::DistExpression::DistWeight>
                                     ._16_8_ + 0x18) + 0x20));
      uVar1 = expressions.stackBase._24_8_;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_210,None);
      iVar3 = Expression::bind((int)pEVar6,(sockaddr *)uVar1,(socklen_t)local_210.m_bits);
      local_218 = (Expression *)CONCAT44(extraout_var,iVar3);
      result._0_4_ = weightExpr._4_4_;
      local_208 = local_218;
      std::optional<slang::ast::DistExpression::DistWeight>::
      emplace<slang::ast::DistExpression::DistWeight>
                ((optional<slang::ast::DistExpression::DistWeight> *)&di,(DistWeight *)&result);
      bVar2 = ASTContext::requireIntegral((ASTContext *)expressions.stackBase._24_8_,local_208);
      if (!bVar2) {
        local_f1 = 1;
      }
    }
    SmallVectorBase<slang::ast::DistExpression::DistItem>::
    emplace_back<slang::ast::DistExpression::DistItem&>
              ((SmallVectorBase<slang::ast::DistExpression::DistItem> *)&index,
               (DistItem *)auStack_1f8);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>::iterator_base<slang::syntax::DistItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DistItemSyntax_*,_unsigned_long,_slang::syntax::DistItemSyntax_**,_slang::syntax::DistItemSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>::iterator_base<slang::syntax::DistItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DistItemSyntax_*,_unsigned_long,_slang::syntax::DistItemSyntax_**,_slang::syntax::DistItemSyntax_*&>
                  *)&__end2_1.index);
    iVar9.index = (size_t)__end2_1.list;
    iVar9.list = (ParentList *)item_1;
    __range2_1 = (SeparatedSyntaxList<slang::syntax::DistItemSyntax> *)
                 ((long)&(__range2_1->super_SyntaxListBase)._vptr_SyntaxListBase + 1);
  }
  args = Compilation::getVoidType(comp);
  ppEVar7 = SmallVectorBase<const_slang::ast::Expression_*>::operator[]
                      ((SmallVectorBase<const_slang::ast::Expression_*> *)local_f0,0);
  args_1 = *ppEVar7;
  iVar3 = SmallVectorBase<slang::ast::DistExpression::DistItem>::copy
                    ((SmallVectorBase<slang::ast::DistExpression::DistItem> *)&index,
                     (EVP_PKEY_CTX *)comp,src);
  local_238.data_ = (pointer)CONCAT44(extraout_var_00,iVar3);
  local_248 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  local_228 = (Compilation *)
              BumpAllocator::
              emplace<slang::ast::DistExpression,slang::ast::Type_const&,slang::ast::Expression_const&,nonstd::span_lite::span<slang::ast::DistExpression::DistItem,18446744073709551615ul>,slang::SourceRange>
                        (&comp->super_BumpAllocator,args,args_1,&local_238,&local_248);
  comp_local = local_228;
  if (local_f1 != 0) {
    comp_local = (Compilation *)Expression::badExpr(comp,(Expression *)local_228);
  }
  SmallVector<slang::ast::DistExpression::DistItem,_4UL>::~SmallVector
            ((SmallVector<slang::ast::DistExpression::DistItem,_4UL> *)&index);
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)local_f0);
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> *)&__range2);
  return (Expression *)comp_local;
}

Assistant:

Expression& DistExpression::fromSyntax(Compilation& comp, const ExpressionOrDistSyntax& syntax,
                                       const ASTContext& context) {
    SmallVector<const ExpressionSyntax*> expressions;
    for (auto item : syntax.distribution->items)
        expressions.push_back(item->range);

    SmallVector<const Expression*> bound;
    bool bad =
        !bindMembershipExpressions(context, TokenKind::DistKeyword, /* requireIntegral */ true,
                                   /* unwrapUnpacked */ false, /* allowTypeReferences */ false,
                                   /* allowOpenRange */ true, *syntax.expr, expressions, bound);

    SmallVector<DistItem, 4> items;
    size_t index = 1;
    for (auto item : syntax.distribution->items) {
        DistItem di{*bound[index++], {}};
        if (item->weight) {
            auto weightKind = item->weight->op.kind == TokenKind::ColonSlash ? DistWeight::PerRange
                                                                             : DistWeight::PerValue;
            auto& weightExpr = Expression::bind(*item->weight->expr, context);
            di.weight.emplace(DistWeight{weightKind, weightExpr});

            if (!context.requireIntegral(weightExpr))
                bad = true;
        }

        items.emplace_back(di);
    }

    auto result = comp.emplace<DistExpression>(comp.getVoidType(), *bound[0], items.copy(comp),
                                               syntax.sourceRange());
    if (bad)
        return badExpr(comp, result);

    return *result;
}